

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffers.c
# Opt level: O3

int ffpi2b(fitsfile *fptr,long nvals,long incre,short *values,int *status)

{
  ffswap2(values,nvals);
  if (incre == 2) {
    ffpbyt(fptr,nvals * 2,values,status);
  }
  else {
    ffpbytoff(fptr,2,nvals,incre + -2,values,status);
  }
  return *status;
}

Assistant:

int ffpi2b(fitsfile *fptr, /* I - FITS file pointer                         */
           long nvals,     /* I - number of pixels in the values array      */
           long incre,     /* I - byte increment between pixels             */
           short *values,  /* I - array of values to write                  */
           int *status)    /* IO - error status                             */
/*
  put (write) the array of values to the FITS file, doing machine dependent
  format conversion (e.g. byte-swapping) if necessary.
*/
{
#if BYTESWAPPED
    ffswap2(values, nvals);  /* reverse order of bytes in each value */
#endif

    if (incre == 2)      /* write all the values at once (contiguous bytes) */

        ffpbyt(fptr, nvals * 2, values, status);

    else         /* have to write each value individually (not contiguous ) */

        ffpbytoff(fptr, 2, nvals, incre - 2, values, status);

    return(*status);
}